

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unixCurrentTime(unqlite_vfs *pVfs,Sytm *pOut)

{
  tm *ptVar1;
  time_t tt;
  time_t tStack_18;
  
  time(&tStack_18);
  ptVar1 = gmtime(&tStack_18);
  if (ptVar1 != (tm *)0x0) {
    pOut->tm_hour = ptVar1->tm_hour;
    pOut->tm_min = ptVar1->tm_min;
    pOut->tm_sec = ptVar1->tm_sec;
    pOut->tm_mon = ptVar1->tm_mon;
    pOut->tm_mday = ptVar1->tm_mday;
    pOut->tm_year = ptVar1->tm_year + 0x76c;
    pOut->tm_yday = ptVar1->tm_yday;
    pOut->tm_wday = ptVar1->tm_wday;
    pOut->tm_isdst = ptVar1->tm_isdst;
    pOut->tm_zone = (char *)0x0;
    pOut->tm_gmtoff = 0;
  }
  return 0;
}

Assistant:

static int unixCurrentTime(unqlite_vfs *pVfs,Sytm *pOut)
{
	struct tm *pTm;
	time_t tt;
	SXUNUSED(pVfs);
	time(&tt);
	pTm = gmtime(&tt);
	if( pTm ){ /* Yes, it can fail */
		STRUCT_TM_TO_SYTM(pTm,pOut);
	}
	return UNQLITE_OK;
}